

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O3

void show_temp_role(CHAR_DATA *ch)

{
  BUFFER *buffer;
  char *pcVar1;
  
  send_to_char("Role entry in progress:\n\r",ch);
  pcVar1 = ch->pcdata->temp_role;
  if ((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) {
    buffer = new_buf();
    add_buf(buffer,ch->pcdata->temp_role);
    pcVar1 = buf_string(buffer);
    page_to_char(pcVar1,ch);
    free_buf(buffer);
    return;
  }
  send_to_char("You have no role in progress.\n\r",ch);
  return;
}

Assistant:

void show_temp_role(CHAR_DATA *ch)
{
	send_to_char("Role entry in progress:\n\r", ch);

	if (ch->pcdata->temp_role == nullptr || ch->pcdata->temp_role[0] == '\0')
	{
		send_to_char("You have no role in progress.\n\r", ch);
	}
	else
	{
		auto output = new_buf();
		add_buf(output, ch->pcdata->temp_role);
		page_to_char(buf_string(output), ch);
		free_buf(output);
	}
}